

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

arena_t * arena_new(tsdn_t *tsdn,uint ind,extent_hooks_t *extent_hooks)

{
  int8_t *piVar1;
  _Bool _Var2;
  dss_prec_t dVar3;
  base_t *base;
  long lVar4;
  arena_t *arena;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  arena_t *paVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  if (ind == 0) {
    base = b0get();
  }
  else {
    base = base_new(tsdn,ind,extent_hooks);
    if (base == (base_t *)0x0) {
      return (arena_t *)0x0;
    }
  }
  iVar10 = 0;
  iVar11 = 0;
  iVar12 = 0;
  iVar13 = 0;
  lVar4 = 0x8c;
  do {
    iVar10 = iVar10 + *(int *)((long)&background_thread_lock.field_0 + lVar4 + 0x38);
    iVar11 = iVar11 + *(int *)((long)&background_thread_lock.field_0 + lVar4 + 0x60);
    iVar12 = iVar12 + *(int *)((long)&n_background_threads + lVar4);
    iVar13 = iVar13 + *(int *)((long)&bin_infos[0].reg_size + lVar4);
    lVar4 = lVar4 + 0xa0;
  } while (lVar4 != 0x62c);
  arena = (arena_t *)
          base_alloc(tsdn,base,(ulong)(uint)(iVar13 + iVar11 + iVar12 + iVar10) * 0x118 + 0x7338,
                     0x40);
  if (arena != (arena_t *)0x0) {
    arena->nthreads[0].repr = 0;
    arena->nthreads[1].repr = 0;
    arena->last_thd = (tsdn_t *)0x0;
    arena->tcache_ql = (tcache_t *)0x0;
    arena->cache_bin_array_descriptor_ql = (cache_bin_array_descriptor_t *)0x0;
    _Var2 = malloc_mutex_init(&arena->tcache_ql_mtx,"tcache_ql",0xd,malloc_mutex_rank_exclusive);
    if (!_Var2) {
      (arena->offset_state).repr = (size_t)arena;
      (arena->extent_sn_next).repr = 0;
      dVar3 = extent_dss_prec_get();
      (arena->dss_prec).repr = dVar3;
      (arena->nactive).repr = 0;
      (arena->large).qlh_first = (extent_t *)0x0;
      _Var2 = malloc_mutex_init(&arena->large_mtx,"arena_large",0x14,malloc_mutex_rank_exclusive);
      if ((((!_Var2) &&
           (_Var2 = extents_init(tsdn,&arena->extents_dirty,extent_state_dirty,true), !_Var2)) &&
          (_Var2 = extents_init(tsdn,&arena->extents_muzzy,extent_state_muzzy,false), !_Var2)) &&
         (((_Var2 = extents_init(tsdn,&arena->extents_retained,extent_state_retained,false), !_Var2
           && (_Var2 = arena_decay_init(&arena->decay_dirty,dirty_decay_ms_default.repr,
                                        &(arena->stats).decay_dirty), !_Var2)) &&
          (_Var2 = arena_decay_init(&arena->decay_muzzy,muzzy_decay_ms_default.repr,
                                    &(arena->stats).decay_muzzy), !_Var2)))) {
        for (lVar4 = 0x3f; 0x3fffffUL >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
        uVar6 = (uint)lVar4;
        iVar10 = uVar6 - 0xe;
        if (uVar6 < 0xe) {
          iVar10 = 0;
        }
        bVar5 = (char)lVar4 - 3;
        if (uVar6 < 0xf) {
          bVar5 = 0xc;
        }
        arena->extent_grow_next =
             ((uint)(((0x1fffffUL >> (bVar5 & 0x3f)) << (bVar5 & 0x3f)) >> (bVar5 & 0x3f)) & 3) +
             iVar10 * 4;
        for (lVar4 = 0x3f; 0xdfffffffffffffffU >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
        uVar6 = (uint)lVar4;
        iVar10 = uVar6 - 0xe;
        if (uVar6 < 0xe) {
          iVar10 = 0;
        }
        bVar5 = (char)lVar4 - 3;
        if (uVar6 < 0xf) {
          bVar5 = 0xc;
        }
        arena->retain_grow_limit =
             ((uint)(((0x6fffffffffffffffU >> (bVar5 & 0x3f)) << (bVar5 & 0x3f)) >> (bVar5 & 0x3f))
             & 3) + iVar10 * 4;
        _Var2 = malloc_mutex_init(&arena->extent_grow_mtx,"extent_grow",0xe,
                                  malloc_mutex_rank_exclusive);
        if (!_Var2) {
          extent_avail_new(&arena->extent_avail);
          _Var2 = malloc_mutex_init(&arena->extent_avail_mtx,"extent_avail",0x10,
                                    malloc_mutex_rank_exclusive);
          if (!_Var2) {
            paVar8 = arena + 1;
            (arena->binshard_next).repr = 0;
            lVar4 = 0;
            do {
              uVar7 = (ulong)bin_infos[lVar4].n_shards;
              arena->bins[lVar4].bin_shards = (bin_t *)paVar8;
              iVar10 = 0;
              if (uVar7 != 0) {
                lVar9 = 0;
                do {
                  _Var2 = bin_init((bin_t *)((long)&((arena->bins[lVar4].bin_shards)->lock).field_0
                                            + lVar9));
                  if (_Var2) {
                    iVar10 = 5;
                    goto LAB_00118a93;
                  }
                  lVar9 = lVar9 + 0x118;
                } while (uVar7 * 0x118 != lVar9);
                iVar10 = 0;
              }
LAB_00118a93:
              if (iVar10 != 0) {
                if (iVar10 != 5) {
                  return arena;
                }
                break;
              }
              paVar8 = (arena_t *)(paVar8->nthreads + uVar7 * 0x46);
              lVar4 = lVar4 + 1;
              if (lVar4 == 0x24) {
                arena->base = base;
                arena_set(ind,arena);
                nstime_init(&arena->create_time,0);
                nstime_update_impl(&arena->create_time);
                if (ind == 0) {
                  return arena;
                }
                piVar1 = &(tsdn->tsd).
                          cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
                *piVar1 = *piVar1 + '\x01';
                if ((tsdn->tsd).state.repr == '\0') {
                  tsd_slow_update(&tsdn->tsd);
                }
                if (test_hooks_arena_new_hook != (_func_void_varargs *)0x0) {
                  (*test_hooks_arena_new_hook)();
                }
                piVar1 = &(tsdn->tsd).
                          cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
                *piVar1 = *piVar1 + -1;
                if (*piVar1 == '\0') {
                  tsd_slow_update(&tsdn->tsd);
                  return arena;
                }
                return arena;
              }
            } while( true );
          }
        }
      }
    }
  }
  if (ind != 0) {
    base_delete(tsdn,base);
  }
  return (arena_t *)0x0;
}

Assistant:

arena_t *
arena_new(tsdn_t *tsdn, unsigned ind, extent_hooks_t *extent_hooks) {
	arena_t *arena;
	base_t *base;
	unsigned i;

	if (ind == 0) {
		base = b0get();
	} else {
		base = base_new(tsdn, ind, extent_hooks);
		if (base == NULL) {
			return NULL;
		}
	}

	unsigned nbins_total = 0;
	for (i = 0; i < SC_NBINS; i++) {
		nbins_total += bin_infos[i].n_shards;
	}
	size_t arena_size = sizeof(arena_t) + sizeof(bin_t) * nbins_total;
	arena = (arena_t *)base_alloc(tsdn, base, arena_size, CACHELINE);
	if (arena == NULL) {
		goto label_error;
	}

	atomic_store_u(&arena->nthreads[0], 0, ATOMIC_RELAXED);
	atomic_store_u(&arena->nthreads[1], 0, ATOMIC_RELAXED);
	arena->last_thd = NULL;

	if (config_stats) {
		if (arena_stats_init(tsdn, &arena->stats)) {
			goto label_error;
		}

		ql_new(&arena->tcache_ql);
		ql_new(&arena->cache_bin_array_descriptor_ql);
		if (malloc_mutex_init(&arena->tcache_ql_mtx, "tcache_ql",
		    WITNESS_RANK_TCACHE_QL, malloc_mutex_rank_exclusive)) {
			goto label_error;
		}
	}

	if (config_prof) {
		if (prof_accum_init(tsdn, &arena->prof_accum)) {
			goto label_error;
		}
	}

	if (config_cache_oblivious) {
		/*
		 * A nondeterministic seed based on the address of arena reduces
		 * the likelihood of lockstep non-uniform cache index
		 * utilization among identical concurrent processes, but at the
		 * cost of test repeatability.  For debug builds, instead use a
		 * deterministic seed.
		 */
		atomic_store_zu(&arena->offset_state, config_debug ? ind :
		    (size_t)(uintptr_t)arena, ATOMIC_RELAXED);
	}

	atomic_store_zu(&arena->extent_sn_next, 0, ATOMIC_RELAXED);

	atomic_store_u(&arena->dss_prec, (unsigned)extent_dss_prec_get(),
	    ATOMIC_RELAXED);

	atomic_store_zu(&arena->nactive, 0, ATOMIC_RELAXED);

	extent_list_init(&arena->large);
	if (malloc_mutex_init(&arena->large_mtx, "arena_large",
	    WITNESS_RANK_ARENA_LARGE, malloc_mutex_rank_exclusive)) {
		goto label_error;
	}

	/*
	 * Delay coalescing for dirty extents despite the disruptive effect on
	 * memory layout for best-fit extent allocation, since cached extents
	 * are likely to be reused soon after deallocation, and the cost of
	 * merging/splitting extents is non-trivial.
	 */
	if (extents_init(tsdn, &arena->extents_dirty, extent_state_dirty,
	    true)) {
		goto label_error;
	}
	/*
	 * Coalesce muzzy extents immediately, because operations on them are in
	 * the critical path much less often than for dirty extents.
	 */
	if (extents_init(tsdn, &arena->extents_muzzy, extent_state_muzzy,
	    false)) {
		goto label_error;
	}
	/*
	 * Coalesce retained extents immediately, in part because they will
	 * never be evicted (and therefore there's no opportunity for delayed
	 * coalescing), but also because operations on retained extents are not
	 * in the critical path.
	 */
	if (extents_init(tsdn, &arena->extents_retained, extent_state_retained,
	    false)) {
		goto label_error;
	}

	if (arena_decay_init(&arena->decay_dirty,
	    arena_dirty_decay_ms_default_get(), &arena->stats.decay_dirty)) {
		goto label_error;
	}
	if (arena_decay_init(&arena->decay_muzzy,
	    arena_muzzy_decay_ms_default_get(), &arena->stats.decay_muzzy)) {
		goto label_error;
	}

	arena->extent_grow_next = sz_psz2ind(HUGEPAGE);
	arena->retain_grow_limit = sz_psz2ind(SC_LARGE_MAXCLASS);
	if (malloc_mutex_init(&arena->extent_grow_mtx, "extent_grow",
	    WITNESS_RANK_EXTENT_GROW, malloc_mutex_rank_exclusive)) {
		goto label_error;
	}

	extent_avail_new(&arena->extent_avail);
	if (malloc_mutex_init(&arena->extent_avail_mtx, "extent_avail",
	    WITNESS_RANK_EXTENT_AVAIL, malloc_mutex_rank_exclusive)) {
		goto label_error;
	}

	/* Initialize bins. */
	uintptr_t bin_addr = (uintptr_t)arena + sizeof(arena_t);
	atomic_store_u(&arena->binshard_next, 0, ATOMIC_RELEASE);
	for (i = 0; i < SC_NBINS; i++) {
		unsigned nshards = bin_infos[i].n_shards;
		arena->bins[i].bin_shards = (bin_t *)bin_addr;
		bin_addr += nshards * sizeof(bin_t);
		for (unsigned j = 0; j < nshards; j++) {
			bool err = bin_init(&arena->bins[i].bin_shards[j]);
			if (err) {
				goto label_error;
			}
		}
	}
	assert(bin_addr == (uintptr_t)arena + arena_size);

	arena->base = base;
	/* Set arena before creating background threads. */
	arena_set(ind, arena);

	nstime_init(&arena->create_time, 0);
	nstime_update(&arena->create_time);

	/* We don't support reentrancy for arena 0 bootstrapping. */
	if (ind != 0) {
		/*
		 * If we're here, then arena 0 already exists, so bootstrapping
		 * is done enough that we should have tsd.
		 */
		assert(!tsdn_null(tsdn));
		pre_reentrancy(tsdn_tsd(tsdn), arena);
		if (test_hooks_arena_new_hook) {
			test_hooks_arena_new_hook();
		}
		post_reentrancy(tsdn_tsd(tsdn));
	}

	return arena;
label_error:
	if (ind != 0) {
		base_delete(tsdn, base);
	}
	return NULL;
}